

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O2

wchar_t cmd_get_arg_choice(command_conflict *cmd,char *arg,int *choice)

{
  wchar_t wVar1;
  cmd_arg_data_conflict data;
  
  wVar1 = cmd_get_arg(cmd,arg,arg_CHOICE,&data);
  if (wVar1 == L'\0') {
    *choice = data.choice;
  }
  return wVar1;
}

Assistant:

int cmd_get_arg_choice(struct command *cmd, const char *arg, int *choice)
{
	union cmd_arg_data data;
	int err;

	if ((err = cmd_get_arg(cmd, arg, arg_CHOICE, &data)) == CMD_OK)
		*choice = data.choice;

	return err;
}